

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O0

void strsort(uchar **strings,Lcp *lcps,int lo,int hi)

{
  uchar *p;
  int iVar1;
  int local_34;
  int cmpr;
  int i;
  uchar *pivotStr;
  int gt;
  int lt;
  int hi_local;
  int lo_local;
  Lcp *lcps_local;
  uchar **strings_local;
  
  if (lo < hi) {
    p = strings[lo];
    local_34 = lo + 1;
    pivotStr._0_4_ = hi;
    pivotStr._4_4_ = lo;
    while (local_34 <= (int)pivotStr) {
      iVar1 = lcpstrcmp(p,strings[local_34],lcps + local_34);
      if (iVar1 < 0) {
        exch(strings,lcps,pivotStr._4_4_,local_34);
        local_34 = local_34 + 1;
        pivotStr._4_4_ = pivotStr._4_4_ + 1;
      }
      else if (iVar1 < 1) {
        local_34 = local_34 + 1;
      }
      else {
        exch(strings,lcps,local_34,(int)pivotStr);
        pivotStr._0_4_ = (int)pivotStr + -1;
      }
    }
    lcpsort<true>(strings,lcps,lo,pivotStr._4_4_ + -1);
    lcpsort<false>(strings,lcps,(int)pivotStr + 1,hi);
  }
  return;
}

Assistant:

void strsort(unsigned char * strings[], Lcp lcps[], int lo, int hi )
{
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  unsigned char  *  pivotStr = strings[lo];
  for( int i = lo + 1; i <= gt; )
    {
      int cmpr = lcpstrcmp( pivotStr, strings[i], lcps[i] );
      if      (cmpr < 0) exch( strings, lcps, lt++, i++);
      else if (cmpr > 0) exch( strings, lcps, i, gt--);
      else            i++;
    }

  lcpsort<true> ( strings, lcps, lo, lt-1 );
  lcpsort<false>( strings, lcps, gt+1, hi );  
}